

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O1

void __thiscall
llm_build_t5_enc::llm_build_t5_enc
          (llm_build_t5_enc *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint32_t uVar1;
  llama_hparams *plVar2;
  pointer plVar3;
  ggml_tensor *pgVar4;
  llm_graph_input_attn_no_cache *inp;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  ggml_tensor *pgVar7;
  ggml_tensor *kq_b;
  pointer plVar8;
  long lVar9;
  int il;
  long lVar10;
  ggml_tensor *local_58;
  
  llm_graph_context::llm_graph_context(&this->super_llm_graph_context,params);
  plVar2 = (this->super_llm_graph_context).hparams;
  uVar1 = plVar2->n_embd_head_v;
  if (uVar1 != plVar2->n_embd_head_k) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x28dd,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  local_58 = llm_graph_context::build_inp_embd(&this->super_llm_graph_context,model->tok_embd);
  pgVar4 = llm_graph_context::build_inp_pos_bucket_enc(&this->super_llm_graph_context);
  inp = llm_graph_context::build_attn_inp_no_cache(&this->super_llm_graph_context);
  if (0 < (this->super_llm_graph_context).n_layer) {
    lVar9 = 0;
    lVar10 = 0;
    do {
      il = (int)lVar10;
      pgVar5 = llm_graph_context::build_norm
                         (&this->super_llm_graph_context,local_58,
                          *(ggml_tensor **)
                           ((long)&((model->layers).
                                    super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->attn_norm_enc + lVar9
                           ),(ggml_tensor *)0x0,LLM_NORM_RMS,il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"attn_norm",il);
      pgVar6 = llm_graph_context::build_lora_mm
                         (&this->super_llm_graph_context,
                          *(ggml_tensor **)
                           ((long)&((model->layers).
                                    super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->wq_enc + lVar9),
                          pgVar5);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"Qcur",il);
      pgVar7 = llm_graph_context::build_lora_mm
                         (&this->super_llm_graph_context,
                          *(ggml_tensor **)
                           ((long)&((model->layers).
                                    super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->wk_enc + lVar9),
                          pgVar5);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"Kcur",il);
      pgVar5 = llm_graph_context::build_lora_mm
                         (&this->super_llm_graph_context,
                          *(ggml_tensor **)
                           ((long)&((model->layers).
                                    super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->wv_enc + lVar9),
                          pgVar5);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"Vcur",il);
      pgVar6 = (ggml_tensor *)
               ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar6,uVar1,
                               (this->super_llm_graph_context).n_head,
                               (long)(this->super_llm_graph_context).n_tokens);
      pgVar7 = (ggml_tensor *)
               ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar7,uVar1,
                               (this->super_llm_graph_context).n_head_kv,
                               (long)(this->super_llm_graph_context).n_tokens);
      pgVar5 = (ggml_tensor *)
               ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar5,uVar1,
                               (this->super_llm_graph_context).n_head_kv);
      plVar3 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
      plVar8 = (pointer)((long)&plVar3->attn_norm + lVar9);
      if (*(long *)((long)&plVar3->attn_rel_b_enc + lVar9) == 0) {
        plVar8 = plVar3;
      }
      kq_b = llm_graph_context::build_pos_bias
                       (&this->super_llm_graph_context,pgVar4,plVar8->attn_rel_b_enc);
      pgVar5 = llm_graph_context::build_attn
                         (&this->super_llm_graph_context,inp,gf,
                          *(ggml_tensor **)
                           ((long)&((model->layers).
                                    super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->wo_enc + lVar9),
                          (ggml_tensor *)0x0,pgVar6,pgVar7,pgVar5,kq_b,(ggml_tensor *)0x0,1.0,il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"kqv_out",il);
      if (lVar10 == (this->super_llm_graph_context).n_layer + -1) {
        pgVar6 = llm_graph_context::build_inp_out_ids(&this->super_llm_graph_context);
        pgVar5 = (ggml_tensor *)ggml_get_rows((this->super_llm_graph_context).ctx0,pgVar5,pgVar6);
        local_58 = (ggml_tensor *)
                   ggml_get_rows((this->super_llm_graph_context).ctx0,local_58,pgVar6);
      }
      pgVar6 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar5,local_58);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"ffn_inp",il);
      pgVar7 = llm_graph_context::build_norm
                         (&this->super_llm_graph_context,pgVar6,
                          *(ggml_tensor **)
                           ((long)&((model->layers).
                                    super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->ffn_norm_enc + lVar9)
                          ,(ggml_tensor *)0x0,LLM_NORM_RMS,il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"ffn_norm",il);
      plVar3 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
      pgVar5 = *(ggml_tensor **)((long)&plVar3->ffn_gate_enc + lVar9);
      pgVar5 = llm_graph_context::build_ffn
                         (&this->super_llm_graph_context,pgVar7,
                          *(ggml_tensor **)((long)&plVar3->ffn_up_enc + lVar9),(ggml_tensor *)0x0,
                          (ggml_tensor *)0x0,pgVar5,(ggml_tensor *)0x0,(ggml_tensor *)0x0,
                          *(ggml_tensor **)((long)&plVar3->ffn_down_enc + lVar9),(ggml_tensor *)0x0,
                          (ggml_tensor *)0x0,(ggml_tensor *)0x0,
                          (pgVar5 == (ggml_tensor *)0x0) + LLM_FFN_GELU,
                          (uint)(pgVar5 != (ggml_tensor *)0x0),il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"ffn_out",il);
      pgVar5 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar5,pgVar6);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"ffn_out",il);
      local_58 = llm_graph_context::build_cvec(&this->super_llm_graph_context,pgVar5,il);
      llm_graph_context::cb(&this->super_llm_graph_context,local_58,"l_out",il);
      lVar10 = lVar10 + 1;
      lVar9 = lVar9 + 0x4f0;
    } while (lVar10 < (this->super_llm_graph_context).n_layer);
  }
  llm_graph_context::cb(&this->super_llm_graph_context,local_58,"result_embd",-1);
  pgVar4 = llm_graph_context::build_norm
                     (&this->super_llm_graph_context,local_58,model->output_norm_enc,
                      (ggml_tensor *)0x0,LLM_NORM_RMS,-1);
  llm_graph_context::cb(&this->super_llm_graph_context,pgVar4,"result_norm",-1);
  ((this->super_llm_graph_context).res._M_t.
   super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
   super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
   super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_embd = pgVar4;
  ggml_build_forward_expand(gf,pgVar4);
  return;
}

Assistant:

llm_build_t5_enc(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        ggml_tensor * pos_bucket_enc = build_inp_pos_bucket_enc();

        auto * inp_attn = build_attn_inp_no_cache();

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            // norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm_enc, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq_enc, cur);
                cb(Qcur, "Qcur", il);

                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk_enc, cur);
                cb(Kcur, "Kcur", il);

                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv_enc, cur);
                cb(Vcur, "Vcur", il);

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                ggml_tensor * attn_rel_b = model.layers[il].attn_rel_b_enc ? model.layers[il].attn_rel_b_enc : model.layers[0].attn_rel_b_enc;
                ggml_tensor * kq_b = build_pos_bias(pos_bucket_enc, attn_rel_b);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo_enc, nullptr,
                        Qcur, Kcur, Vcur, kq_b, nullptr, 1.0f, il);
                cb(cur, "kqv_out", il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            // feed-forward network
            {
                cur = build_norm(ffn_inp,
                        model.layers[il].ffn_norm_enc, NULL,
                        LLM_NORM_RMS, il);
                cb(cur, "ffn_norm", il);

                // T5 uses relu, flan-T5 uses gelu-gated
                cur = build_ffn(cur,
                        model.layers[il].ffn_up_enc,   NULL, NULL,
                        model.layers[il].ffn_gate_enc, NULL, NULL,
                        model.layers[il].ffn_down_enc, NULL, NULL,
                        NULL,
                        model.layers[il].ffn_gate_enc ? LLM_FFN_GELU : LLM_FFN_RELU,
                        model.layers[il].ffn_gate_enc ? LLM_FFN_PAR  : LLM_FFN_SEQ,
                        il);
                cb(cur, "ffn_out", il);
            }

            cur = ggml_add(ctx0, cur, ffn_inp);
            cb(cur, "ffn_out", il);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;
        cb(cur, "result_embd", -1);

        cur = build_norm(cur,
                model.output_norm_enc, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        ggml_build_forward_expand(gf, cur);
    }